

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

int Gia_ManPerformGla(Gia_Man_t *pAig,Abs_Par_t *pPars)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint *puVar3;
  byte *pbVar4;
  Gia_Obj_t *pGVar5;
  void *pvVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  Vec_Int_t *pVVar13;
  int *piVar14;
  Abc_Cex_t *pAVar15;
  Gia_Man_t *pGVar16;
  char *pcVar17;
  undefined8 *puVar18;
  void *pvVar19;
  Vec_Wrd_t *p;
  word *pwVar20;
  undefined8 *puVar21;
  Abc_Frame_t *pAbc;
  Vec_Int_t *pVVar22;
  Vec_Int_t *pVVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  char *pcVar29;
  uint uVar30;
  timespec *ptVar31;
  timespec *ptVar32;
  Vec_Int_t *pVVar33;
  Gia_Man_t *pGVar34;
  Ga2_Man_t *p_00;
  Gia_Man_t *pGVar35;
  Abs_Par_t *pAVar36;
  int iVar37;
  double dVar38;
  long local_478;
  int Lit;
  uint local_45c;
  int local_458;
  int local_454;
  Gia_Man_t *local_450;
  int local_448;
  int local_444;
  Gia_Man_t *local_440;
  uint local_434;
  int local_430;
  uint local_42c;
  Abs_Par_t *local_428;
  Gia_Man_t *local_420;
  timespec ts;
  
  iVar9 = clock_gettime(3,(timespec *)&ts);
  if (iVar9 < 0) {
    local_478 = -1;
  }
  else {
    local_478 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  pPars->iFrame = -1;
  if (pAig->vCos->nSize - pAig->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                  ,0x5e6,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
  }
  pAVar15 = pAig->pCexSeq;
  if (pAVar15 != (Abc_Cex_t *)0x0) {
    free(pAVar15);
    pAig->pCexSeq = (Abc_Cex_t *)0x0;
  }
  pVVar23 = pAig->vCos;
  iVar9 = pAig->nRegs;
  if (pVVar23->nSize <= iVar9) {
LAB_0055cc5e:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  local_428 = pPars;
  if (pVVar23->nSize < 1) {
LAB_0055cc7d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar11 = *pVVar23->pArray;
  if (((long)iVar11 < 0) || (uVar30 = pAig->nObjs, (int)uVar30 <= iVar11)) {
LAB_0055cc20:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar2 = pAig->pObjs;
  pGVar5 = pGVar2 + iVar11;
  uVar10 = (uint)*(undefined8 *)pGVar5;
  if ((~*(ulong *)(pGVar5 + -(ulong)(uVar10 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0) {
    if ((uVar10 >> 0x1d & 1) == 0) {
      Abc_Print((int)pAVar15,"Sequential miter is trivially UNSAT.\n");
      return 1;
    }
    pAVar15 = Abc_CexMakeTriv(iVar9,pAig->vCis->nSize - iVar9,1,0);
    pAig->pCexSeq = pAVar15;
    Abc_Print(iVar9,"Sequential miter is trivially SAT.\n");
    return 0;
  }
  local_440 = pAig;
  if (pAig->vGateClasses == (Vec_Int_t *)0x0) {
    pVVar13 = (Vec_Int_t *)malloc(0x10);
    uVar10 = 0x10;
    if (0xe < uVar30 - 1) {
      uVar10 = uVar30;
    }
    pVVar13->nSize = 0;
    pVVar13->nCap = uVar10;
    if (uVar10 == 0) {
      piVar14 = (int *)0x0;
    }
    else {
      piVar14 = (int *)malloc((long)(int)uVar10 << 2);
    }
    pVVar13->pArray = piVar14;
    pVVar13->nSize = uVar30;
    memset(piVar14,0,(long)(int)uVar30 << 2);
    local_440->vGateClasses = pVVar13;
    if ((int)uVar30 < 1) {
LAB_0055ce2f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    *piVar14 = 1;
    if (pVVar23->nSize <= iVar9) goto LAB_0055cc5e;
    if (pVVar23->nSize < 1) goto LAB_0055cc7d;
    uVar10 = *pVVar23->pArray;
    if (uVar30 <= uVar10) goto LAB_0055cc20;
    if ((int)uVar30 <= (int)uVar10) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar10 = uVar10 - (*(uint *)(pGVar2 + uVar10) & 0x1fffffff);
    if (uVar30 <= uVar10) goto LAB_0055ce2f;
    piVar14[uVar10] = 1;
  }
  pAVar36 = local_428;
  pGVar35 = local_440;
  pGVar16 = (Gia_Man_t *)Ga2_ManStart(local_440,local_428);
  pGVar34 = (Gia_Man_t *)0x3;
  iVar9 = clock_gettime(3,(timespec *)&ts);
  if (iVar9 < 0) {
    lVar25 = -1;
  }
  else {
    lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  *(long *)&pGVar16->pFanData = lVar25 - local_478;
  if (*(int *)(pGVar16->pSpec + 0x70) != 0) {
    Abc_Print((int)pGVar34,"Running gate-level abstraction (GLA) with the following parameters:\n");
    Abc_Print(pAVar36->nRatioMin2,
              "FrameMax = %d  ConfMax = %d  Timeout = %d  Limit = %d %%  Limit2 = %d %%  RatioMax = %d %%\n"
              ,(ulong)(uint)pAVar36->nFramesMax,(ulong)(uint)pAVar36->nConfLimit,
              (ulong)(uint)pAVar36->nTimeOut,(ulong)(uint)pAVar36->nRatioMin,
              (ulong)(uint)pAVar36->nRatioMin2,(ulong)(uint)pAVar36->nRatioMax);
    pGVar34 = (Gia_Man_t *)(ulong)(uint)pAVar36->fUseSimple;
    Abc_Print(pAVar36->fUseSimple,
              "LrnStart = %d  LrnDelta = %d  LrnRatio = %d %%  Skip = %d  SimpleCNF = %d  Dump = %d\n"
              ,(ulong)(uint)pAVar36->nLearnedStart,(ulong)(uint)pAVar36->nLearnedDelta,
              (ulong)(uint)pAVar36->nLearnedPerce,(ulong)(uint)pAVar36->fUseSkip,pGVar34,
              (ulong)(uint)(pAVar36->fDumpMabs | pAVar36->fDumpVabs));
    if (pAVar36->fDumpVabs == 0) {
      if (pAVar36->fDumpMabs != 0) {
        pcVar29 = "Miter with abstraction map";
        goto LAB_0055acfe;
      }
    }
    else {
      pcVar29 = "Abstracted model";
LAB_0055acfe:
      pGVar34 = pGVar16;
      pcVar17 = Ga2_GlaGetFileName((Ga2_Man_t *)pGVar16,pAVar36->fDumpVabs);
      Abc_Print((int)pGVar34,"%s will be dumped into file \"%s\".\n",pcVar29,pcVar17);
    }
    Abc_Print((int)pGVar34,
              " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n"
             );
  }
  local_45c = 0xffffffff;
  local_454 = 0;
  pVVar13 = (Vec_Int_t *)0x0;
  local_458 = -1;
  local_450 = pGVar16;
  do {
    iVar9 = (int)pGVar34;
    if ((pAVar36->nFramesMax != 0) && (pAVar36->nFramesMax <= (int)pVVar13)) goto LAB_0055c040;
    pcVar29 = pGVar16->pSpec;
    pcVar29[0x78] = -1;
    pcVar29[0x79] = -1;
    pcVar29[0x7a] = -1;
    pcVar29[0x7b] = -1;
    pGVar34 = pGVar16;
    Ga2_ManRestart((Ga2_Man_t *)pGVar16);
    iVar11 = 0;
    if (pAVar36->nFramesMax < 0) {
      pVVar13 = (Vec_Int_t *)0x0;
    }
    else {
      local_434 = pGVar16->pMuxes[1];
      pVVar13 = (Vec_Int_t *)0x0;
      do {
        local_444 = *(int *)(*(long *)&pGVar16->fSweeper + 0x230);
        local_42c = pGVar16->pMuxes[1];
        local_430 = *(int *)(*(long *)&pGVar16->nXors + 4);
        uVar10 = (uint)pVVar13;
        *(uint *)(pGVar16->pSpec + 0x78) = uVar10;
        puVar3 = *(uint **)&pGVar16->nHTable;
        uVar30 = puVar3[1];
        if (pVVar13 == (Vec_Int_t *)(ulong)uVar30) {
          puVar18 = (undefined8 *)malloc(0x10);
          *puVar18 = 0;
          puVar18[1] = 0;
          uVar1 = *puVar3;
          if (uVar30 == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (*(void **)(puVar3 + 2) == (void *)0x0) {
                pvVar19 = malloc(0x80);
              }
              else {
                pvVar19 = realloc(*(void **)(puVar3 + 2),0x80);
              }
              *(void **)(puVar3 + 2) = pvVar19;
              uVar30 = 0x10;
            }
            else {
              uVar30 = uVar1 * 2;
              if ((int)uVar30 <= (int)uVar1) goto LAB_0055ae42;
              if (*(void **)(puVar3 + 2) == (void *)0x0) {
                pvVar19 = malloc((ulong)uVar1 << 4);
              }
              else {
                pvVar19 = realloc(*(void **)(puVar3 + 2),(ulong)uVar1 << 4);
              }
              *(void **)(puVar3 + 2) = pvVar19;
            }
            *puVar3 = uVar30;
          }
LAB_0055ae42:
          uVar30 = puVar3[1];
          puVar3[1] = uVar30 + 1;
          *(undefined8 **)(*(long *)(puVar3 + 2) + (long)(int)uVar30 * 8) = puVar18;
          pVVar23 = pVVar13;
          pGVar16 = local_450;
        }
        if ((long)*(int *)(*(long *)&pGVar16->nHTable + 4) <= (long)pVVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Vec_IntFillExtra(*(Vec_Int_t **)
                          (*(long *)(*(long *)&pGVar16->nHTable + 8) + (long)pVVar13 * 8),
                         *(int *)(*(long *)&pGVar16->nXors + 4),-1);
        pGVar34 = pGVar16;
        Ga2_ManAddAbsClauses((Ga2_Man_t *)pGVar16,uVar10);
        pGVar35 = local_440;
        pcVar29 = pGVar16->pSpec;
        if ((*(int *)(pcVar29 + 0x44) == 0) ||
           (iVar11 = 7, (long)*(int *)(pcVar29 + 0x7c) < (long)pVVar13)) {
          if ((long)*(int *)(pcVar29 + 4) == 0 || (long)*(int *)(pcVar29 + 4) < (long)pVVar13) {
            iVar9 = local_440->vCos->nSize;
            if (iVar9 <= local_440->nRegs) goto LAB_0055cc5e;
            if (iVar9 < 1) goto LAB_0055cc7d;
            iVar9 = *local_440->vCos->pArray;
            if (((long)iVar9 < 0) || (local_440->nObjs <= iVar9)) goto LAB_0055cc20;
            pGVar34 = pGVar16;
            Lit = Ga2_ObjFindLit((Ga2_Man_t *)pGVar16,
                                 local_440->pObjs + iVar9 +
                                 -(ulong)((uint)*(undefined8 *)(local_440->pObjs + iVar9) &
                                         0x1fffffff),uVar10);
            if (Lit < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                            ,0x62e,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
            }
            iVar9 = pGVar35->vCos->nSize;
            if (iVar9 <= pGVar35->nRegs) goto LAB_0055cc5e;
            if (iVar9 < 1) goto LAB_0055cc7d;
            iVar9 = *pGVar35->vCos->pArray;
            if (((long)iVar9 < 0) || (pGVar35->nObjs <= iVar9)) goto LAB_0055cc20;
            Lit = *(uint *)(pGVar35->pObjs + iVar9) >> 0x1d & 1 ^ Lit;
            if (Lit == 0) {
              iVar11 = 7;
            }
            else {
              if (Lit == 1) {
                __assert_fail("Lit > 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                              ,0x632,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
              }
              if ((*(sat_solver2 **)&pGVar16->fSweeper)->size < *(int *)&pGVar16->pRefs) {
                sat_solver2_setnvars(*(sat_solver2 **)&pGVar16->fSweeper,*(int *)&pGVar16->pRefs);
              }
              if (Lit < 0) {
LAB_0055cc01:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                              ,0x10c,"int Abc_Lit2Var(int)");
              }
              local_448 = *(int *)&pGVar16->pRefs;
              iVar9 = 0;
              while( true ) {
                ptVar32 = (timespec *)&ts;
                uVar30 = (uint)Lit >> 1;
                iVar11 = var_is_assigned(*(sat_solver2 **)&pGVar16->fSweeper,uVar30);
                if (iVar11 != 0) break;
                iVar11 = clock_gettime(3,ptVar32);
                if (iVar11 < 0) {
                  lVar25 = 1;
                }
                else {
                  lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                  lVar25 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + ts.tv_sec * -1000000;
                }
                iVar12 = sat_solver2_solve(*(sat_solver2 **)&pGVar16->fSweeper,&Lit,
                                           (lit *)&local_45c,(long)pAVar36->nConfLimit,0,0,0);
                if (iVar12 != 1) {
                  pGVar34 = (Gia_Man_t *)0x3;
                  iVar11 = clock_gettime(3,ptVar32);
                  uVar30 = (uint)ptVar32;
                  if (iVar11 < 0) {
                    lVar26 = -1;
                  }
                  else {
                    lVar26 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  *(long *)&pGVar16->vFanoutNums = *(long *)&pGVar16->vFanoutNums + lVar26 + lVar25;
                  iVar11 = 0xb;
                  if (iVar12 == 0) goto LAB_0055bd6a;
                  if (*(long *)(*(long *)&pGVar16->fSweeper + 0x260) != 0) {
                    pGVar34 = (Gia_Man_t *)0x3;
                    ptVar32 = (timespec *)&ts;
                    iVar12 = clock_gettime(3,ptVar32);
                    uVar30 = (uint)ptVar32;
                    if (iVar12 < 0) {
                      lVar25 = -1;
                    }
                    else {
                      lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                    }
                    if (*(long *)(*(long *)&pGVar16->fSweeper + 0x260) < lVar25) goto LAB_0055bd6a;
                  }
                  pcVar29 = pGVar16->pSpec;
                  if (iVar9 == 0) {
                    if ((long)*(int *)(pcVar29 + 0x7c) < (long)pVVar13) {
                      *(int *)(pcVar29 + 0x80) = *(int *)(pcVar29 + 0x80) + 1;
                    }
                    goto LAB_0055b69f;
                  }
                  if ((long)*(int *)(pcVar29 + 0x7c) < (long)pVVar13) {
                    pcVar29[0x80] = '\0';
                    pcVar29[0x81] = '\0';
                    pcVar29[0x82] = '\0';
                    pcVar29[0x83] = '\0';
                  }
                  if ((*(sat_solver2 **)&pGVar16->fSweeper)->pPrf2 == (Prf_Man_t *)0x0) {
                    __assert_fail("p->pSat->pPrf2 != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                  ,0x694,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                  }
                  pVVar22 = (Vec_Int_t *)Sat_ProofCore(*(sat_solver2 **)&pGVar16->fSweeper);
                  lVar25 = *(long *)&pGVar16->fSweeper;
                  pvVar19 = *(void **)(lVar25 + 0x1e8);
                  if (pvVar19 != (void *)0x0) {
                    pvVar6 = *(void **)((long)pvVar19 + 0x20);
                    if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                      free(*(void **)((long)pvVar6 + 8));
                      *(undefined8 *)((long)pvVar6 + 8) = 0;
                    }
                    if (pvVar6 != (void *)0x0) {
                      free(pvVar6);
                    }
                    pvVar6 = *(void **)((long)pvVar19 + 0x18);
                    if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                      free(*(void **)((long)pvVar6 + 8));
                      *(undefined8 *)((long)pvVar6 + 8) = 0;
                    }
                    if (pvVar6 != (void *)0x0) {
                      free(pvVar6);
                    }
                    free(pvVar19);
                  }
                  pGVar34 = local_450;
                  *(undefined8 *)(lVar25 + 0x1e8) = 0;
                  sat_solver2_rollback(*(sat_solver2 **)&local_450->fSweeper);
                  iVar37 = local_448;
                  Ga2_ManShrinkAbs((Ga2_Man_t *)pGVar34,local_42c,local_430,local_448);
                  piVar14 = *(int **)&pGVar34->fSweeper;
                  iVar12 = *piVar14;
                  if (iVar37 != iVar12) {
                    __assert_fail("nVarsOld == p->pSat->size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                  ,0x6a4,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                  }
                  if (piVar14[2] != piVar14[3]) {
LAB_0055ccda:
                    __assert_fail("s->qhead == s->qtail",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.h"
                                  ,0xfa,"void sat_solver2_bookmark(sat_solver2 *)");
                  }
                  piVar14[0x36] = iVar12;
                  piVar14[0x37] = piVar14[2];
                  pbVar4 = *(byte **)(piVar14 + 0x72);
                  if (pbVar4 != (byte *)0x0) {
                    piVar14[0x38] =
                         (*(int *)(pbVar4 + 0xc) << (*pbVar4 & 0x1f)) +
                         **(int **)(*(long *)(pbVar4 + 0x18) + (long)*(int *)(pbVar4 + 0xc) * 8);
                  }
                  *(undefined8 *)(piVar14 + 0x22) = *(undefined8 *)(piVar14 + 0x1e);
                  piVar14[0x20] =
                       piVar14[0x24] << (*(byte *)(piVar14 + 0x26) & 0x1f) |
                       **(uint **)(*(long *)(piVar14 + 0x2a) + (long)piVar14[0x24] * 8);
                  piVar14[0x21] =
                       piVar14[0x25] << (*(byte *)(piVar14 + 0x26) & 0x1f) |
                       **(uint **)(*(long *)(piVar14 + 0x2a) + (long)piVar14[0x25] * 8);
                  if (*(void **)(piVar14 + 0x10) != (void *)0x0) {
                    piVar14[0xc] = piVar14[0xb];
                    memcpy(*(void **)(piVar14 + 0x10),*(void **)(piVar14 + 0xe),(long)iVar12 << 2);
                  }
                  lVar25 = *(long *)&pGVar34->fSweeper;
                  if (*(long *)(lVar25 + 0x1e8) != 0) {
                    __assert_fail("p->pSat->pPrf2 == NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                  ,0x6a7,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                  }
                  puVar18 = (undefined8 *)calloc(1,0x30);
                  *puVar18 = 0xffffffffffffffff;
                  puVar21 = (undefined8 *)malloc(0x10);
                  pVVar23 = (Vec_Int_t *)0x3e8;
                  *puVar21 = 1000;
                  pvVar19 = malloc(8000);
                  puVar21[1] = pvVar19;
                  puVar18[3] = puVar21;
                  puVar21 = (undefined8 *)malloc(0x10);
                  *puVar21 = 1000;
                  pvVar19 = malloc(4000);
                  pAVar36 = local_428;
                  puVar21[1] = pvVar19;
                  puVar18[4] = puVar21;
                  *(undefined8 **)(lVar25 + 0x1e8) = puVar18;
                  pGVar34->nBufs = 0;
                  pGVar5 = pGVar34->pObjs;
                  uVar30 = *(uint *)(pGVar34->pName + 0x18);
                  if ((int)*(uint *)pGVar5 < (int)uVar30) {
                    if (*(void **)&pGVar5->Value == (void *)0x0) {
                      pvVar19 = malloc((long)(int)uVar30 << 2);
                    }
                    else {
                      pvVar19 = realloc(*(void **)&pGVar5->Value,(long)(int)uVar30 << 2);
                    }
                    *(void **)&pGVar5->Value = pvVar19;
                    if (pvVar19 == (void *)0x0) {
LAB_0055cd75:
                      __assert_fail("p->pArray",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                    }
                    *(uint *)pGVar5 = uVar30;
                  }
                  if (0 < (int)uVar30) {
                    memset(*(void **)&pGVar5->Value,0xff,(ulong)uVar30 * 4);
                  }
                  pGVar16 = local_450;
                  *(uint *)&pGVar5->field_0x4 = uVar30;
                  piVar14 = *(int **)(*(long *)&local_450->fSweeper + 0x1e8);
                  if (*piVar14 != -1) {
LAB_0055ccf9:
                    __assert_fail("p->iFirst == -1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satProof2.h"
                                  ,0x7a,"void Prf_ManRestart(Prf_Man_t *, Vec_Int_t *, int, int)");
                  }
                  uVar30 = pVVar22->nSize;
                  pGVar5 = local_450->pObjs;
                  *piVar14 = *(int *)(*(long *)&local_450->fSweeper + 0x210);
                  piVar14[2] = (((int)uVar30 >> 6) + 1) - (uint)((uVar30 & 0x3f) == 0);
                  *(Gia_Obj_t **)(piVar14 + 10) = pGVar5;
                  piVar14[4] = 0;
                  piVar14[5] = 0;
                  *(undefined4 *)(*(long *)(piVar14 + 6) + 4) = 0;
                  Ga2_ManAddToAbs((Ga2_Man_t *)local_450,pVVar22);
                  if (pVVar22->pArray != (int *)0x0) {
                    free(pVVar22->pArray);
                    pVVar22->pArray = (int *)0x0;
                  }
                  if (pVVar22 != (Vec_Int_t *)0x0) {
                    free(pVVar22);
                  }
                  iVar12 = clock_gettime(3,(timespec *)&ts);
                  if (iVar12 < 0) {
                    lVar25 = 1;
                  }
                  else {
                    lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                    lVar25 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + ts.tv_sec * -1000000;
                  }
                  pGVar34 = *(Gia_Man_t **)&pGVar16->fSweeper;
                  iVar12 = sat_solver2_solve((sat_solver2 *)pGVar34,&Lit,(lit *)&local_45c,
                                             (long)pAVar36->nConfLimit,0,0,0);
                  if (iVar12 != -1) {
                    if (iVar12 != 0) {
                      __assert_fail("Status == l_False",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                    ,0x6b7,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                    }
                    goto LAB_0055bd6a;
                  }
                  iVar11 = clock_gettime(3,(timespec *)&ts);
                  if (iVar11 < 0) {
                    lVar26 = -1;
                  }
                  else {
                    lVar26 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  *(long *)&pGVar16->vFanoutNums = *(long *)&pGVar16->vFanoutNums + lVar26 + lVar25;
                  if ((*(sat_solver2 **)&pGVar16->fSweeper)->pPrf2 == (Prf_Man_t *)0x0) {
                    __assert_fail("p->pSat->pPrf2 != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                  ,0x6bb,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                  }
                  pVVar22 = (Vec_Int_t *)Sat_ProofCore(*(sat_solver2 **)&pGVar16->fSweeper);
                  lVar25 = *(long *)&pGVar16->fSweeper;
                  pvVar19 = *(void **)(lVar25 + 0x1e8);
                  if (pvVar19 != (void *)0x0) {
                    pvVar6 = *(void **)((long)pvVar19 + 0x20);
                    if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                      free(*(void **)((long)pvVar6 + 8));
                      *(undefined8 *)((long)pvVar6 + 8) = 0;
                    }
                    if (pvVar6 != (void *)0x0) {
                      free(pvVar6);
                    }
                    pvVar6 = *(void **)((long)pvVar19 + 0x18);
                    if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                      free(*(void **)((long)pvVar6 + 8));
                      *(undefined8 *)((long)pvVar6 + 8) = 0;
                    }
                    if (pvVar6 != (void *)0x0) {
                      free(pvVar6);
                    }
                    free(pvVar19);
                  }
                  pGVar16 = local_450;
                  *(undefined8 *)(lVar25 + 0x1e8) = 0;
                  sat_solver2_rollback(*(sat_solver2 **)&local_450->fSweeper);
                  Ga2_ManShrinkAbs((Ga2_Man_t *)pGVar16,local_42c,local_430,local_448);
                  pVVar33 = pVVar22;
                  Ga2_ManAddToAbs((Ga2_Man_t *)pGVar16,pVVar22);
                  uVar30 = (uint)pVVar33;
                  if (pVVar22->pArray != (int *)0x0) {
                    free(pVVar22->pArray);
                    pVVar22->pArray = (int *)0x0;
                  }
                  if (pVVar22 != (Vec_Int_t *)0x0) {
                    free(pVVar22);
                  }
                  goto LAB_0055b69f;
                }
                piVar14 = (int *)((long)&pGVar16->pRefs + 4);
                *piVar14 = *piVar14 + 1;
                p_00 = (Ga2_Man_t *)0x3;
                ptVar31 = ptVar32;
                iVar11 = clock_gettime(3,ptVar32);
                iVar12 = (int)ptVar31;
                if (iVar11 < 0) {
                  lVar26 = -1;
                }
                else {
                  lVar26 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                *(int **)&pGVar16->nFansAlloc =
                     (int *)((long)*(int **)&pGVar16->nFansAlloc + lVar26 + lVar25);
                iVar11 = Abc_FrameIsBridgeMode();
                if (local_454 != 0 && iVar11 != 0) {
                  Gia_Ga2SendCancel(p_00,iVar12);
                  local_454 = 0;
                }
                if (-1 < (int)local_45c) {
                  Gia_GlaProveCancel(pAVar36->fVerbose);
                  local_45c = 0xffffffff;
                }
                iVar11 = clock_gettime(3,ptVar32);
                if (iVar11 < 0) {
                  lVar25 = 1;
                }
                else {
                  lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                  lVar25 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + ts.tv_sec * -1000000;
                }
                pGVar16->pHTable[8] = iVar9;
                local_420 = (Gia_Man_t *)Ga2_ManRefine((Ga2_Man_t *)pGVar16);
                pGVar34 = (Gia_Man_t *)0x3;
                iVar11 = clock_gettime(3,ptVar32);
                if (iVar11 < 0) {
                  lVar26 = -1;
                }
                else {
                  lVar26 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                pGVar16->vFanout = (Vec_Int_t *)((long)&pGVar16->vFanout->nCap + lVar26 + lVar25);
                if (local_420 == (Gia_Man_t *)0x0) {
                  iVar11 = 0xb;
                  if (pAVar36->fVerbose != 0) {
                    iVar12 = *(int *)(*(long *)&pGVar16->fSweeper + 0x230);
                    iVar37 = clock_gettime(3,(timespec *)&ts);
                    if (iVar37 < 0) {
                      lVar25 = -1;
                    }
                    else {
                      lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                    }
                    pGVar34 = pGVar16;
                    Ga2_ManAbsPrintFrame
                              ((Ga2_Man_t *)pGVar16,uVar10,iVar12 - local_444,iVar9,
                               lVar25 - local_478,1);
                  }
                  goto LAB_0055bd6a;
                }
                piVar14 = *(int **)&pGVar16->fSweeper;
                if (iVar9 == 0) {
                  iVar11 = *piVar14;
                  if (local_448 != iVar11) {
                    __assert_fail("nVarsOld == p->pSat->size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                  ,0x666,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                  }
                  if (piVar14[2] != piVar14[3]) goto LAB_0055ccda;
                  piVar14[0x36] = iVar11;
                  piVar14[0x37] = piVar14[2];
                  pbVar4 = *(byte **)(piVar14 + 0x72);
                  if (pbVar4 != (byte *)0x0) {
                    piVar14[0x38] =
                         (*(int *)(pbVar4 + 0xc) << (*pbVar4 & 0x1f)) +
                         **(int **)(*(long *)(pbVar4 + 0x18) + (long)*(int *)(pbVar4 + 0xc) * 8);
                  }
                  *(undefined8 *)(piVar14 + 0x22) = *(undefined8 *)(piVar14 + 0x1e);
                  piVar14[0x20] =
                       piVar14[0x24] << (*(byte *)(piVar14 + 0x26) & 0x1f) |
                       **(uint **)(*(long *)(piVar14 + 0x2a) + (long)piVar14[0x24] * 8);
                  piVar14[0x21] =
                       piVar14[0x25] << (*(byte *)(piVar14 + 0x26) & 0x1f) |
                       **(uint **)(*(long *)(piVar14 + 0x2a) + (long)piVar14[0x25] * 8);
                  if (*(void **)(piVar14 + 0x10) != (void *)0x0) {
                    piVar14[0xc] = piVar14[0xb];
                    memcpy(*(void **)(piVar14 + 0x10),*(void **)(piVar14 + 0xe),(long)iVar11 << 2);
                  }
                  lVar25 = *(long *)&pGVar16->fSweeper;
                  if (*(long *)(lVar25 + 0x1e8) != 0) {
                    __assert_fail("p->pSat->pPrf2 == NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                  ,0x669,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                  }
                  puVar18 = (undefined8 *)calloc(1,0x30);
                  *puVar18 = 0xffffffffffffffff;
                  puVar21 = (undefined8 *)malloc(0x10);
                  *puVar21 = 1000;
                  pvVar19 = malloc(8000);
                  puVar21[1] = pvVar19;
                  puVar18[3] = puVar21;
                  puVar21 = (undefined8 *)malloc(0x10);
                  *puVar21 = 1000;
                  pvVar19 = malloc(4000);
                  puVar21[1] = pvVar19;
                  puVar18[4] = puVar21;
                  *(undefined8 **)(lVar25 + 0x1e8) = puVar18;
                  pGVar16->nBufs = 0;
                  pGVar5 = pGVar16->pObjs;
                  uVar30 = *(uint *)(pGVar16->pName + 0x18);
                  if ((int)*(uint *)pGVar5 < (int)uVar30) {
                    if (*(void **)&pGVar5->Value == (void *)0x0) {
                      pvVar19 = malloc((long)(int)uVar30 << 2);
                    }
                    else {
                      pvVar19 = realloc(*(void **)&pGVar5->Value,(long)(int)uVar30 << 2);
                    }
                    *(void **)&pGVar5->Value = pvVar19;
                    if (pvVar19 == (void *)0x0) goto LAB_0055cd75;
                    *(uint *)pGVar5 = uVar30;
                  }
                  if (0 < (int)uVar30) {
                    memset(*(void **)&pGVar5->Value,0xff,(ulong)uVar30 * 4);
                  }
                  *(uint *)&pGVar5->field_0x4 = uVar30;
                  piVar14 = *(int **)(*(long *)&local_450->fSweeper + 0x1e8);
                  if (*piVar14 != -1) goto LAB_0055ccf9;
                  uVar30 = *(int *)((long)&local_420->pName + 4);
                  pGVar5 = local_450->pObjs;
                  *piVar14 = *(int *)(*(long *)&local_450->fSweeper + 0x210);
                  piVar14[2] = (((int)uVar30 >> 6) + 1) - (uint)((uVar30 & 0x3f) == 0);
                  *(Gia_Obj_t **)(piVar14 + 10) = pGVar5;
                  piVar14[4] = 0;
                  piVar14[5] = 0;
                  *(undefined4 *)(*(long *)(piVar14 + 6) + 4) = 0;
                  pGVar16 = local_450;
                }
                else {
                  piVar14 = *(int **)(piVar14 + 0x7a);
                  if (piVar14 != (int *)0x0) {
                    if (*piVar14 < 0) {
                      __assert_fail("p->iFirst >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satProof2.h"
                                    ,0x85,"void Prf_ManGrow(Prf_Man_t *, int)");
                    }
                    if (*(long *)(piVar14 + 4) != 0) {
                      __assert_fail("p->pInfo == NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satProof2.h"
                                    ,0x86,"void Prf_ManGrow(Prf_Man_t *, int)");
                    }
                    uVar30 = *(int *)((long)&local_420->pName + 4) + pGVar16->nBufs;
                    iVar11 = piVar14[2];
                    if (iVar11 * 0x40 <= (int)uVar30) {
                      iVar12 = (((int)uVar30 >> 6) + 1) - (uint)((uVar30 & 0x3f) == 0);
                      iVar37 = iVar11 * 2;
                      if (iVar12 == iVar37 || SBORROW4(iVar12,iVar37) != iVar12 + iVar11 * -2 < 0) {
                        iVar12 = iVar37;
                      }
                      iVar11 = *(int *)(*(long *)(piVar14 + 6) + 4) / iVar11;
                      iVar37 = (iVar11 + 1000) * iVar12;
                      p = (Vec_Wrd_t *)malloc(0x10);
                      if (iVar37 - 1U < 0xf) {
                        iVar37 = 0x10;
                      }
                      p->nSize = 0;
                      p->nCap = iVar37;
                      if (iVar37 == 0) {
                        pwVar20 = (word *)0x0;
                      }
                      else {
                        pwVar20 = (word *)malloc((long)iVar37 << 3);
                      }
                      p->pArray = pwVar20;
                      if (0 < iVar11) {
                        iVar37 = 0;
                        do {
                          uVar30 = piVar14[2] * iVar37;
                          if (((int)uVar30 < 0) ||
                             (*(int *)(*(long *)(piVar14 + 6) + 4) <= (int)uVar30)) {
                            __assert_fail("i >= 0 && i < p->nSize",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                                          ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                          }
                          *(ulong *)(piVar14 + 4) =
                               (ulong)uVar30 * 8 + *(long *)(*(long *)(piVar14 + 6) + 8);
                          lVar25 = 0;
                          if (0 < piVar14[2]) {
                            do {
                              Vec_WrdPush(p,*(word *)(*(long *)(piVar14 + 4) + lVar25 * 8));
                              lVar25 = lVar25 + 1;
                            } while (lVar25 < piVar14[2]);
                          }
                          uVar30 = iVar12 - (int)lVar25;
                          pVVar23 = (Vec_Int_t *)(ulong)uVar30;
                          if (uVar30 != 0 && (int)lVar25 <= iVar12) {
                            do {
                              Vec_WrdPush(p,0);
                              uVar30 = (int)pVVar23 - 1;
                              pVVar23 = (Vec_Int_t *)(ulong)uVar30;
                            } while (uVar30 != 0);
                          }
                          iVar37 = iVar37 + 1;
                        } while (iVar37 != iVar11);
                      }
                      pvVar19 = *(void **)(piVar14 + 6);
                      if (*(void **)((long)pvVar19 + 8) != (void *)0x0) {
                        free(*(void **)((long)pvVar19 + 8));
                        *(undefined8 *)((long)pvVar19 + 8) = 0;
                      }
                      if (pvVar19 != (void *)0x0) {
                        free(pvVar19);
                      }
                      *(Vec_Wrd_t **)(piVar14 + 6) = p;
                      piVar14[2] = iVar12;
                      piVar14[4] = 0;
                      piVar14[5] = 0;
                      pGVar16 = local_450;
                    }
                  }
                }
                pGVar34 = local_420;
                Ga2_ManAddToAbs((Ga2_Man_t *)pGVar16,(Vec_Int_t *)local_420);
                if (pGVar34->pSpec != (char *)0x0) {
                  free(pGVar34->pSpec);
                  pGVar34->pSpec = (char *)0x0;
                }
                free(pGVar34);
                pAVar36 = local_428;
                if (local_428->fVerbose != 0) {
                  iVar11 = *(int *)(*(long *)&pGVar16->fSweeper + 0x230);
                  iVar12 = clock_gettime(3,(timespec *)&ts);
                  if (iVar12 < 0) {
                    lVar25 = -1;
                  }
                  else {
                    lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  pGVar34 = pGVar16;
                  Ga2_ManAbsPrintFrame
                            ((Ga2_Man_t *)pGVar16,uVar10,iVar11 - local_444,iVar9 + 1,
                             lVar25 - local_478,0);
                }
                if ((pAVar36->nRatioMin2 != 0) &&
                   ((pAVar36->nRatioMin2 * *(int *)((long)&pGVar16->vCis + 4)) / 100 <=
                    (int)pGVar16->pMuxes[1])) {
                  iVar11 = 0xb;
                  goto LAB_0055bd6a;
                }
                iVar9 = iVar9 + 1;
                if (Lit < 0) goto LAB_0055cc01;
              }
              lVar25 = *(long *)&pGVar16->fSweeper;
              pvVar19 = *(void **)(lVar25 + 0x1e8);
              if (pvVar19 != (void *)0x0) {
                pvVar6 = *(void **)((long)pvVar19 + 0x20);
                if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                  free(*(void **)((long)pvVar6 + 8));
                  *(undefined8 *)((long)pvVar6 + 8) = 0;
                }
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
                pvVar6 = *(void **)((long)pvVar19 + 0x18);
                if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                  free(*(void **)((long)pvVar6 + 8));
                  *(undefined8 *)((long)pvVar6 + 8) = 0;
                }
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
                free(pvVar19);
              }
              *(undefined8 *)(lVar25 + 0x1e8) = 0;
              pGVar16 = local_450;
LAB_0055b69f:
              if ((long)*(int *)(pGVar16->pSpec + 0x7c) < (long)pVVar13) {
                *(uint *)(pGVar16->pSpec + 0x7c) = uVar10;
              }
              if (pAVar36->fVerbose != 0) {
                iVar11 = *(int *)(*(long *)&pGVar16->fSweeper + 0x230);
                iVar12 = clock_gettime(3,(timespec *)&ts);
                if (iVar12 < 0) {
                  lVar25 = -1;
                }
                else {
                  lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                pVVar22 = pVVar13;
                Ga2_ManAbsPrintFrame
                          ((Ga2_Man_t *)pGVar16,uVar10,iVar11 - local_444,iVar9,lVar25 - local_478,1
                          );
                uVar30 = (uint)pVVar22;
              }
              pGVar34 = (Gia_Man_t *)(ulong)(uint)pAVar36->fVerbose;
              iVar12 = Gia_GlaProveCheck(pAVar36->fVerbose);
              iVar11 = 0xb;
              if (iVar12 == 0) {
                if (iVar9 != 0) {
                  if (*(int *)(pGVar16->pSpec + 0x74) != 0) {
                    uVar30 = 0x82007d;
                    Abc_Print((int)pGVar34,"\n");
                  }
                  pGVar35 = local_440;
                  if (local_440->vGateClasses != (Vec_Int_t *)0x0) {
                    piVar14 = local_440->vGateClasses->pArray;
                    if (piVar14 != (int *)0x0) {
                      free(piVar14);
                      pGVar35->vGateClasses->pArray = (int *)0x0;
                    }
                    if (pGVar35->vGateClasses != (Vec_Int_t *)0x0) {
                      free(pGVar35->vGateClasses);
                      pGVar35->vGateClasses = (Vec_Int_t *)0x0;
                    }
                  }
                  pGVar34 = pGVar16;
                  pVVar22 = Ga2_ManAbsTranslate((Ga2_Man_t *)pGVar16);
                  pGVar35->vGateClasses = pVVar22;
                  if ((pAVar36->nRatioMin != 0) &&
                     ((pAVar36->nRatioMin * *(int *)((long)&pGVar16->vCis + 4)) / 100 <=
                      (int)pGVar16->pMuxes[1])) goto LAB_0055bd6a;
                }
                pGVar35 = local_440;
                pcVar29 = pGVar16->pSpec;
                if (*(int *)(pcVar29 + 0x80) == *(int *)(pcVar29 + 0x84)) {
                  if ((*(int *)(pcVar29 + 0x54) != 0) || (*(int *)(pcVar29 + 0x58) != 0)) {
                    Abc_FrameSetStatus(-1);
                    Abc_FrameSetCex((Abc_Cex_t *)0x0);
                    Abc_FrameSetNFrames(uVar10);
                    pcVar29 = *(char **)(pGVar16->pSpec + 0x68);
                    if (pcVar29 == (char *)0x0) {
                      pcVar29 = "glabs.aig";
                    }
                    pcVar29 = Extra_FileNameGenericAppend(pcVar29,".status");
                    sprintf((char *)&ts,"write_status %s",pcVar29);
                    pAbc = Abc_FrameGetGlobalFrame();
                    Cmd_CommandExecute(pAbc,(char *)&ts);
                    uVar30 = pAVar36->fVerbose;
                    pGVar34 = pGVar16;
                    Ga2_GlaDumpAbsracted((Ga2_Man_t *)pGVar16,uVar30);
                  }
                  if (*(int *)(pGVar16->pSpec + 0x5c) != 0) {
                    if (-1 < (int)local_45c) {
                      Gia_GlaProveCancel(pAVar36->fVerbose);
                    }
                    uVar30 = pAVar36->fSimpProver;
                    Gia_GlaProveAbsracted(pGVar35,uVar30,pAVar36->fVeryVerbose);
                    piVar14 = (int *)((long)&pGVar16->vLevels + 4);
                    *piVar14 = *piVar14 + 1;
                    pGVar34 = pGVar35;
                    local_45c = uVar10;
                  }
                  iVar11 = Abc_FrameIsBridgeMode();
                  if (iVar11 != 0) {
                    if (local_454 != 0) {
                      Gia_Ga2SendCancel((Ga2_Man_t *)pGVar34,uVar30);
                    }
                    pGVar34 = pGVar16;
                    Gia_Ga2SendAbsracted((Ga2_Man_t *)pGVar16,uVar30);
                    local_454 = 1;
                  }
                }
                if (pAVar36->nRatioMax == 0) goto LAB_0055bd64;
                iVar11 = 0;
                if ((iVar9 != 0) &&
                   (((((Vec_Int_t *)0x14 < pVVar13 || (100 < (int)pGVar16->pMuxes[1])) &&
                     ((int)(pAVar36->nRatioMax * local_434) / 100 <=
                      (int)(pGVar16->pMuxes[1] - local_434))) &&
                    (iVar11 = 5, *(int *)(pGVar16->pSpec + 0x70) != 0)))) {
                  Abc_Print((int)pGVar34,
                            "Forcing restart because abstraction grew from %d to %d (more than %d %%).\n"
                            ,(ulong)local_434);
                }
              }
              else {
                local_458 = 1;
              }
            }
          }
          else {
LAB_0055bd64:
            iVar11 = 7;
          }
        }
LAB_0055bd6a:
        pGVar35 = local_440;
        if ((iVar11 != 0) && (iVar11 != 7)) {
          if (iVar11 != 5) goto LAB_0055c02f;
          break;
        }
        pVVar13 = (Vec_Int_t *)((long)&pVVar13->nCap + 1);
      } while ((int)pVVar13 < pAVar36->nFramesMax || pAVar36->nFramesMax == 0);
      iVar11 = 0;
    }
LAB_0055c02f:
    iVar9 = (int)pGVar34;
  } while (iVar11 == 0);
  if (iVar11 != 0xb) {
    return (int)pVVar23;
  }
LAB_0055c040:
  lVar25 = *(long *)&pGVar16->fSweeper;
  pvVar19 = *(void **)(lVar25 + 0x1e8);
  if (pvVar19 != (void *)0x0) {
    pvVar6 = *(void **)((long)pvVar19 + 0x20);
    if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
      free(*(void **)((long)pvVar6 + 8));
      *(undefined8 *)((long)pvVar6 + 8) = 0;
    }
    if (pvVar6 != (void *)0x0) {
      free(pvVar6);
    }
    pvVar6 = *(void **)((long)pvVar19 + 0x18);
    if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
      free(*(void **)((long)pvVar6 + 8));
      *(undefined8 *)((long)pvVar6 + 8) = 0;
    }
    if (pvVar6 != (void *)0x0) {
      free(pvVar6);
    }
    free(pvVar19);
    iVar9 = (int)pvVar19;
  }
  *(undefined8 *)(lVar25 + 0x1e8) = 0;
  if (-1 < (int)local_45c) {
    iVar9 = pAVar36->fVerbose;
    Gia_GlaProveCancel(iVar9);
  }
  pGVar34 = local_450;
  if (*(int *)&local_450->vCos == 0) {
    Abc_Print(iVar9,"\n");
  }
  if (local_458 == 1) {
    Abc_Print(iVar9,"GLA completed %d frames and proved abstraction derived in frame %d  ",
              (ulong)(*(int *)(pGVar34->pSpec + 0x7c) + 1),(ulong)local_45c);
    local_458 = 1;
    goto LAB_0055c391;
  }
  if (pGVar35->pCexSeq != (Abc_Cex_t *)0x0) {
    if (*(int *)(pGVar34->pSpec + 0x70) != 0) {
      Abc_Print(iVar9,"\n");
    }
    local_458 = 0;
    pGVar16 = pGVar35;
    iVar9 = Gia_ManVerifyCex(pGVar35,pGVar35->pCexSeq,0);
    iVar11 = (int)pGVar16;
    if (iVar9 == 0) {
      Abc_Print(iVar11,"    Gia_ManPerformGlaOld(): CEX verification has failed!\n");
    }
    Abc_Print(iVar11,"True counter-example detected in frame %d.  ",(ulong)pVVar13 & 0xffffffff);
    *(int *)(pGVar34->pSpec + 0x78) = (int)pVVar13 + -1;
    if (pGVar35->vGateClasses != (Vec_Int_t *)0x0) {
      piVar14 = pGVar35->vGateClasses->pArray;
      if (piVar14 != (int *)0x0) {
        free(piVar14);
        pGVar35->vGateClasses->pArray = (int *)0x0;
      }
      if (pGVar35->vGateClasses != (Vec_Int_t *)0x0) {
        free(pGVar35->vGateClasses);
        pGVar35->vGateClasses = (Vec_Int_t *)0x0;
      }
    }
    goto LAB_0055c391;
  }
  if (pGVar35->vGateClasses != (Vec_Int_t *)0x0) {
    piVar14 = pGVar35->vGateClasses->pArray;
    if (piVar14 != (int *)0x0) {
      free(piVar14);
      pGVar35->vGateClasses->pArray = (int *)0x0;
    }
    if (pGVar35->vGateClasses != (Vec_Int_t *)0x0) {
      free(pGVar35->vGateClasses);
      pGVar35->vGateClasses = (Vec_Int_t *)0x0;
    }
  }
  pGVar16 = pGVar34;
  pVVar23 = Ga2_ManAbsTranslate((Ga2_Man_t *)pGVar34);
  iVar9 = (int)pGVar16;
  pGVar35->vGateClasses = pVVar23;
  if (*(int *)(pGVar34->pSpec + 0x20) == 0) {
LAB_0055c290:
    uVar30 = pAVar36->nConfLimit;
    if ((uVar30 != 0) && ((int)uVar30 <= *(int *)(*(long *)&pGVar34->fSweeper + 0x230))) {
      iVar11 = *(int *)(pGVar34->pSpec + 0x7c);
      uVar10 = *(uint *)(pGVar34->pSpec + 0x80);
      pcVar29 = "GLA exceeded %d conflicts in frame %d with a %d-stable abstraction.  ";
      goto LAB_0055c355;
    }
    uVar30 = pAVar36->nRatioMin2;
    uVar27 = (ulong)uVar30;
    if ((uVar30 == 0) ||
       ((int)pGVar34->pMuxes[1] < (int)(*(int *)((long)&pGVar34->vCis + 4) * uVar30) / 100)) {
      uVar30 = pAVar36->nRatioMin;
      uVar27 = (ulong)uVar30;
      if ((uVar30 == 0) ||
         ((int)pGVar34->pMuxes[1] < (int)(*(int *)((long)&pGVar34->vCis + 4) * uVar30) / 100)) {
        uVar24 = (ulong)*(uint *)(pGVar34->pSpec + 0x80);
        uVar27 = (ulong)(*(int *)(pGVar34->pSpec + 0x7c) + 1);
        pcVar29 = "GLA finished %d frames and produced a %d-stable abstraction.  ";
      }
      else {
        uVar24 = (ulong)(*(int *)(pGVar34->pSpec + 0x7c) + 1);
        pcVar29 = "GLA found that the size of abstraction exceeds %d %% in frame %d.  ";
      }
    }
    else {
      uVar24 = (ulong)(*(int *)(pGVar34->pSpec + 0x7c) + 1);
      pcVar29 = 
      "GLA found that the size of abstraction exceeds %d %% in frame %d during refinement.  ";
    }
    Abc_Print(iVar9,pcVar29,uVar27,uVar24);
  }
  else {
    iVar9 = 3;
    iVar11 = clock_gettime(3,(timespec *)&ts);
    if (iVar11 < 0) {
      lVar25 = -1;
    }
    else {
      lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    if (lVar25 < *(long *)(*(long *)&pGVar34->fSweeper + 0x260)) goto LAB_0055c290;
    pcVar29 = pGVar34->pSpec;
    uVar30 = *(uint *)(pcVar29 + 0x20);
    iVar11 = *(int *)(pcVar29 + 0x7c);
    uVar10 = *(uint *)(pcVar29 + 0x80);
    pcVar29 = "GLA reached timeout %d sec in frame %d with a %d-stable abstraction.    ";
LAB_0055c355:
    Abc_Print(iVar9,pcVar29,(ulong)uVar30,(ulong)(iVar11 + 1),(ulong)uVar10);
  }
  *(undefined4 *)(pGVar34->pSpec + 0x78) = *(undefined4 *)(pGVar34->pSpec + 0x7c);
LAB_0055c391:
  iVar11 = 3;
  iVar9 = clock_gettime(3,(timespec *)&ts);
  if (iVar9 < 0) {
    lVar25 = -1;
  }
  else {
    lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(iVar11,"%s =","Time");
  Abc_Print(iVar11,"%9.2f sec\n",SUB84((double)(lVar25 - local_478) / 1000000.0,0));
  if (*(int *)(pGVar34->pSpec + 0x70) != 0) {
    iVar11 = 3;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    lVar26 = -1;
    lVar25 = -1;
    if (-1 < iVar9) {
      lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    pGVar34->vMapping =
         (Vec_Int_t *)
         (lVar25 - ((long)*(int **)&pGVar34->nFansAlloc +
                   (long)&pGVar34->vFanout->nCap +
                   *(long *)&pGVar34->pFanData + *(long *)&pGVar34->vFanoutNums + local_478));
    Abc_Print(iVar11,"%s =","Runtime: Initializing");
    lVar25._0_4_ = *(int *)&pGVar34->pFanData;
    lVar25._4_4_ = *(int *)((long)&pGVar34->pFanData + 4);
    iVar11 = 3;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (-1 < iVar9) {
      lVar26 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    dVar38 = 0.0;
    if (lVar26 != local_478) {
      lVar26._0_4_ = *(int *)&pGVar34->pFanData;
      lVar26._4_4_ = *(int *)((long)&pGVar34->pFanData + 4);
      iVar11 = 3;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar28 = -1;
      }
      else {
        lVar28 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      dVar38 = ((double)lVar26 * 100.0) / (double)(lVar28 - local_478);
    }
    Abc_Print(iVar11,"%9.2f sec (%6.2f %%)\n",SUB84((double)lVar25 / 1000000.0,0),dVar38);
    Abc_Print(iVar11,"%s =","Runtime: Solver UNSAT");
    lVar28._0_4_ = *(int *)&pGVar34->vFanoutNums;
    lVar28._4_4_ = *(int *)((long)&pGVar34->vFanoutNums + 4);
    iVar11 = 3;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (iVar9 < 0) {
      lVar25 = -1;
    }
    else {
      lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    dVar38 = 0.0;
    if (lVar25 != local_478) {
      lVar7._0_4_ = *(int *)&pGVar34->vFanoutNums;
      lVar7._4_4_ = *(int *)((long)&pGVar34->vFanoutNums + 4);
      iVar11 = 3;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      dVar38 = ((double)lVar7 * 100.0) / (double)(lVar25 - local_478);
    }
    Abc_Print(iVar11,"%9.2f sec (%6.2f %%)\n",SUB84((double)lVar28 / 1000000.0,0),dVar38);
    Abc_Print(iVar11,"%s =","Runtime: Solver SAT  ");
    piVar14 = *(int **)&pGVar34->nFansAlloc;
    iVar11 = 3;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (iVar9 < 0) {
      lVar25 = -1;
    }
    else {
      lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    dVar38 = 0.0;
    if (lVar25 != local_478) {
      piVar8 = *(int **)&pGVar34->nFansAlloc;
      iVar11 = 3;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      dVar38 = ((double)(long)piVar8 * 100.0) / (double)(lVar25 - local_478);
    }
    Abc_Print(iVar11,"%9.2f sec (%6.2f %%)\n",SUB84((double)(long)piVar14 / 1000000.0,0),dVar38);
    Abc_Print(iVar11,"%s =","Runtime: Refinement  ");
    pVVar23 = pGVar34->vFanout;
    iVar11 = 3;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (iVar9 < 0) {
      lVar25 = -1;
    }
    else {
      lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    dVar38 = 0.0;
    if (lVar25 != local_478) {
      pVVar13 = pGVar34->vFanout;
      iVar11 = 3;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      dVar38 = ((double)(long)pVVar13 * 100.0) / (double)(lVar25 - local_478);
    }
    Abc_Print(iVar11,"%9.2f sec (%6.2f %%)\n",SUB84((double)(long)pVVar23 / 1000000.0,0),dVar38);
    Abc_Print(iVar11,"%s =","Runtime: Other       ");
    pVVar23 = pGVar34->vMapping;
    iVar11 = 3;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (iVar9 < 0) {
      lVar25 = -1;
    }
    else {
      lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    dVar38 = 0.0;
    if (lVar25 != local_478) {
      pVVar13 = pGVar34->vMapping;
      iVar11 = 3;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      dVar38 = ((double)(long)pVVar13 * 100.0) / (double)(lVar25 - local_478);
    }
    Abc_Print(iVar11,"%9.2f sec (%6.2f %%)\n",SUB84((double)(long)pVVar23 / 1000000.0,0),dVar38);
    Abc_Print(iVar11,"%s =","Runtime: TOTAL       ");
    iVar9 = clock_gettime(3,(timespec *)&ts);
    lVar26 = -1;
    lVar25 = -1;
    if (-1 < iVar9) {
      lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    iVar11 = 3;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (-1 < iVar9) {
      lVar26 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    dVar38 = 0.0;
    if (lVar26 != local_478) {
      iVar9 = clock_gettime(3,(timespec *)&ts);
      lVar28 = -1;
      lVar26 = -1;
      if (-1 < iVar9) {
        lVar26 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      iVar11 = 3;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (-1 < iVar9) {
        lVar28 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      dVar38 = ((double)(lVar26 - local_478) * 100.0) / (double)(lVar28 - local_478);
    }
    Abc_Print(iVar11,"%9.2f sec (%6.2f %%)\n",SUB84((double)(lVar25 - local_478) / 1000000.0,0),
              dVar38);
    Ga2_ManReportMemory((Ga2_Man_t *)pGVar34);
  }
  Ga2_ManStop((Ga2_Man_t *)pGVar34);
  fflush(_stdout);
  return local_458;
}

Assistant:

int Gia_ManPerformGla( Gia_Man_t * pAig, Abs_Par_t * pPars )
{
    int fUseSecondCore = 1;
    Ga2_Man_t * p;
    Vec_Int_t * vCore, * vPPis;
    abctime clk2, clk = Abc_Clock();
    int Status = l_Undef, RetValue = -1, iFrameTryToProve = -1, fOneIsSent = 0;
    int i, c, f, Lit;
    pPars->iFrame = -1;
    // check trivial case 
    assert( Gia_ManPoNum(pAig) == 1 ); 
    ABC_FREE( pAig->pCexSeq );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            Abc_Print( 1, "Sequential miter is trivially UNSAT.\n" );
            return 1;
        }
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        Abc_Print( 1, "Sequential miter is trivially SAT.\n" );
        return 0;
    }
    // create gate classes if not given
    if ( pAig->vGateClasses == NULL )
    {
        pAig->vGateClasses = Vec_IntStart( Gia_ManObjNum(pAig) );
        Vec_IntWriteEntry( pAig->vGateClasses, 0, 1 );
        Vec_IntWriteEntry( pAig->vGateClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)), 1 );
    }
    // start the manager
    p = Ga2_ManStart( pAig, pPars );
    p->timeInit = Abc_Clock() - clk;
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running gate-level abstraction (GLA) with the following parameters:\n" );
        Abc_Print( 1, "FrameMax = %d  ConfMax = %d  Timeout = %d  Limit = %d %%  Limit2 = %d %%  RatioMax = %d %%\n", 
            pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin, pPars->nRatioMin2, pPars->nRatioMax );
        Abc_Print( 1, "LrnStart = %d  LrnDelta = %d  LrnRatio = %d %%  Skip = %d  SimpleCNF = %d  Dump = %d\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce, pPars->fUseSkip, pPars->fUseSimple, pPars->fDumpVabs|pPars->fDumpMabs );
        if ( pPars->fDumpVabs || pPars->fDumpMabs )
            Abc_Print( 1, "%s will be dumped into file \"%s\".\n", 
                pPars->fDumpVabs ? "Abstracted model" : "Miter with abstraction map",
                Ga2_GlaGetFileName(p, pPars->fDumpVabs) );
        Abc_Print( 1, " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n" );
    }
    // iterate unrolling
    for ( i = f = 0; !pPars->nFramesMax || f < pPars->nFramesMax; i++ )
    {
        int nAbsOld;
        // remember the timeframe
        p->pPars->iFrame = -1;
        // create new SAT solver
        Ga2_ManRestart( p );
        // remember abstraction size after the last restart
        nAbsOld = Vec_IntSize(p->vAbs);
        // unroll the circuit
        for ( f = 0; !pPars->nFramesMax || f < pPars->nFramesMax; f++ )
        {
            // remember current limits
            int nConflsBeg = sat_solver2_nconflicts(p->pSat);
            int nAbs       = Vec_IntSize(p->vAbs);
            int nValues    = Vec_IntSize(p->vValues);
            int nVarsOld;
            // remember the timeframe
            p->pPars->iFrame = f;
            // extend and clear storage
            if ( f == Vec_PtrSize(p->vId2Lit) )
                Vec_PtrPush( p->vId2Lit, Vec_IntAlloc(0) );
            Vec_IntFillExtra( Ga2_MapFrameMap(p, f), Vec_IntSize(p->vValues), -1 );
            // add static clauses to this timeframe
            Ga2_ManAddAbsClauses( p, f );
            // skip checking if skipcheck is enabled (&gla -s)
            if ( p->pPars->fUseSkip && f <= p->pPars->iFrameProved )
                continue;
            // skip checking if we need to skip several starting frames (&gla -S <num>)
            if ( p->pPars->nFramesStart && f <= p->pPars->nFramesStart )
                continue;
            // get the output literal
//            Lit = Ga2_ManUnroll_rec( p, Gia_ManPo(pAig,0), f );
            Lit = Ga2_ObjFindLit( p, Gia_ObjFanin0(Gia_ManPo(pAig,0)), f );
            assert( Lit >= 0 );
            Lit = Abc_LitNotCond( Lit, Gia_ObjFaninC0(Gia_ManPo(pAig,0)) );
            if ( Lit == 0 )
                continue;
            assert( Lit > 1 );
            // check for counter-examples
            if ( p->nSatVars > sat_solver2_nvars(p->pSat) )
                sat_solver2_setnvars( p->pSat, p->nSatVars );
            nVarsOld = p->nSatVars;
            for ( c = 0; ; c++ )
            {
                // consider the special case when the target literal is implied false
                // by implications which happened as a result of previous refinements
                // note that incremental UNSAT core cannot be computed because there is no learned clauses
                // in this case, we will assume that UNSAT core cannot reduce the problem
                if ( var_is_assigned(p->pSat, Abc_Lit2Var(Lit)) )
                {
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    break;
                }
                // perform SAT solving
                clk2 = Abc_Clock();
                Status = sat_solver2_solve( p->pSat, &Lit, &Lit+1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( Status == l_True ) // perform refinement
                {
                    p->nCexes++;
                    p->timeSat += Abc_Clock() - clk2;

                    // cancel old one if it was sent
                    if ( Abc_FrameIsBridgeMode() && fOneIsSent )
                    {
                        Gia_Ga2SendCancel( p, pPars->fVerbose );
                        fOneIsSent = 0;
                    }
                    if ( iFrameTryToProve >= 0 )
                    {
                        Gia_GlaProveCancel( pPars->fVerbose );
                        iFrameTryToProve = -1;
                    }

                    // perform refinement
                    clk2 = Abc_Clock();
                    Rnm_ManSetRefId( p->pRnm, c );
                    vPPis = Ga2_ManRefine( p );
                    p->timeCex += Abc_Clock() - clk2;
                    if ( vPPis == NULL )
                    {
                        if ( pPars->fVerbose )
                            Ga2_ManAbsPrintFrame( p, f, sat_solver2_nconflicts(p->pSat)-nConflsBeg, c, Abc_Clock() - clk, 1 );
                        goto finish;
                    }

                    if ( c == 0 )
                    {
//                        Ga2_ManRefinePrintPPis( p );
                        // create bookmark to be used for rollback
                        assert( nVarsOld == p->pSat->size );
                        sat_solver2_bookmark( p->pSat );
                        // start incremental proof manager
                        assert( p->pSat->pPrf2 == NULL );
                        p->pSat->pPrf2 = Prf_ManAlloc();
                        if ( p->pSat->pPrf2 )
                        {
                            p->nProofIds = 0;
                            Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                            Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vPPis) );
                        }
                    }
                    else
                    {
                        // resize the proof logger
                        if ( p->pSat->pPrf2 )
                            Prf_ManGrow( p->pSat->pPrf2, p->nProofIds + Vec_IntSize(vPPis) );
                    }

                    Ga2_ManAddToAbs( p, vPPis );
                    Vec_IntFree( vPPis );
                    if ( pPars->fVerbose )
                        Ga2_ManAbsPrintFrame( p, f, sat_solver2_nconflicts(p->pSat)-nConflsBeg, c+1, Abc_Clock() - clk, 0 );
                    // check if the number of objects is below limit
                    if ( pPars->nRatioMin2 && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin2 / 100 )
                    {
                        Status = l_Undef;
                        goto finish;
                    }
                    continue;
                }
                p->timeUnsat += Abc_Clock() - clk2;
                if ( Status == l_Undef ) // ran out of resources
                    goto finish;
                if ( p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit ) // timeout
                    goto finish;
                if ( c == 0 )
                {
                    if ( f > p->pPars->iFrameProved )
                        p->pPars->nFramesNoChange++;
                    break;
                }
                if ( f > p->pPars->iFrameProved )
                    p->pPars->nFramesNoChange = 0;

                // derive the core
                assert( p->pSat->pPrf2 != NULL );
                vCore = (Vec_Int_t *)Sat_ProofCore( p->pSat );
                Prf_ManStopP( &p->pSat->pPrf2 );
                // update the SAT solver
                sat_solver2_rollback( p->pSat );
                // reduce abstraction
                Ga2_ManShrinkAbs( p, nAbs, nValues, nVarsOld );

                // purify UNSAT core
                if ( fUseSecondCore )
                {
//                    int nOldCore = Vec_IntSize(vCore);
                    // reverse the order of objects in the core
//                    Vec_IntSort( vCore, 0 );
//                    Vec_IntPrint( vCore );
                    // create bookmark to be used for rollback
                    assert( nVarsOld == p->pSat->size );
                    sat_solver2_bookmark( p->pSat );
                    // start incremental proof manager
                    assert( p->pSat->pPrf2 == NULL );
                    p->pSat->pPrf2 = Prf_ManAlloc();
                    if ( p->pSat->pPrf2 )
                    {
                        p->nProofIds = 0;
                        Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                        Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vCore) );

                        Ga2_ManAddToAbs( p, vCore );
                        Vec_IntFree( vCore );
                    }
                    // run SAT solver
                    clk2 = Abc_Clock();
                    Status = sat_solver2_solve( p->pSat, &Lit, &Lit+1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                    if ( Status == l_Undef )
                        goto finish;
                    assert( Status == l_False );
                    p->timeUnsat += Abc_Clock() - clk2;

                    // derive the core
                    assert( p->pSat->pPrf2 != NULL );
                    vCore = (Vec_Int_t *)Sat_ProofCore( p->pSat );
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    // update the SAT solver
                    sat_solver2_rollback( p->pSat );
                    // reduce abstraction
                    Ga2_ManShrinkAbs( p, nAbs, nValues, nVarsOld );
//                    printf( "\n%4d -> %4d\n", nOldCore, Vec_IntSize(vCore) );
                }

                Ga2_ManAddToAbs( p, vCore );
//                Ga2_ManRefinePrint( p, vCore );
                Vec_IntFree( vCore );
                break;
            }
            // remember the last proved frame
            if ( p->pPars->iFrameProved < f )
                p->pPars->iFrameProved = f;
            // print statistics
            if ( pPars->fVerbose )
                Ga2_ManAbsPrintFrame( p, f, sat_solver2_nconflicts(p->pSat)-nConflsBeg, c, Abc_Clock() - clk, 1 );
            // check if abstraction was proved
            if ( Gia_GlaProveCheck( pPars->fVerbose ) )
            {
                RetValue = 1;
                goto finish;
            }
            if ( c > 0 ) 
            {
                if ( p->pPars->fVeryVerbose )
                    Abc_Print( 1, "\n" );
                // recompute the abstraction
                Vec_IntFreeP( &pAig->vGateClasses );
                pAig->vGateClasses = Ga2_ManAbsTranslate( p );
                // check if the number of objects is below limit
                if ( pPars->nRatioMin && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin / 100 )
                {
                    Status = l_Undef;
                    goto finish;
                }
            }
            // check the number of stable frames
            if ( p->pPars->nFramesNoChange == p->pPars->nFramesNoChangeLim )
            {
                // dump the model into file
                if ( p->pPars->fDumpVabs || p->pPars->fDumpMabs )
                {
                    char Command[1000];
                    Abc_FrameSetStatus( -1 );
                    Abc_FrameSetCex( NULL );
                    Abc_FrameSetNFrames( f );
                    sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "glabs.aig"), ".status"));
                    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
                    Ga2_GlaDumpAbsracted( p, pPars->fVerbose );
                }
                // call the prover
                if ( p->pPars->fCallProver )
                {
                    // cancel old one if it is proving
                    if ( iFrameTryToProve >= 0 )
                        Gia_GlaProveCancel( pPars->fVerbose );
                    // prove new one
                    Gia_GlaProveAbsracted( pAig, pPars->fSimpProver, pPars->fVeryVerbose );
                    iFrameTryToProve = f;
                    p->nPdrCalls++;
                }
                // speak to the bridge
                if ( Abc_FrameIsBridgeMode() )
                {
                    // cancel old one if it was sent
                    if ( fOneIsSent )
                        Gia_Ga2SendCancel( p, pPars->fVerbose );
                    // send new one 
                    Gia_Ga2SendAbsracted( p, pPars->fVerbose );
                    fOneIsSent = 1;
                }
            }
            // if abstraction grew more than a certain percentage, force a restart
            if ( pPars->nRatioMax == 0 )
                continue;
            if ( c > 0 && (f > 20 || Vec_IntSize(p->vAbs) > 100) && Vec_IntSize(p->vAbs) - nAbsOld >= nAbsOld * pPars->nRatioMax / 100 )
            {
                if ( p->pPars->fVerbose )
                Abc_Print( 1, "Forcing restart because abstraction grew from %d to %d (more than %d %%).\n", 
                    nAbsOld, Vec_IntSize(p->vAbs), pPars->nRatioMax );
                break;
            }
        }
    }
finish:
    Prf_ManStopP( &p->pSat->pPrf2 );
    // cancel old one if it is proving
    if ( iFrameTryToProve >= 0 )
        Gia_GlaProveCancel( pPars->fVerbose );
    // analize the results
    if ( !p->fUseNewLine )
        Abc_Print( 1, "\n" );
    if ( RetValue == 1 )
        Abc_Print( 1, "GLA completed %d frames and proved abstraction derived in frame %d  ", p->pPars->iFrameProved+1, iFrameTryToProve );
    else if ( pAig->pCexSeq == NULL )
    {
        Vec_IntFreeP( &pAig->vGateClasses );
        pAig->vGateClasses = Ga2_ManAbsTranslate( p );
        if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
            Abc_Print( 1, "GLA reached timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, p->pPars->iFrameProved+1, p->pPars->nFramesNoChange );
        else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
            Abc_Print( 1, "GLA exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, p->pPars->iFrameProved+1, p->pPars->nFramesNoChange );
        else if ( pPars->nRatioMin2 && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin2 / 100 )
            Abc_Print( 1, "GLA found that the size of abstraction exceeds %d %% in frame %d during refinement.  ", pPars->nRatioMin2, p->pPars->iFrameProved+1 );
        else if ( pPars->nRatioMin && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin / 100 )
            Abc_Print( 1, "GLA found that the size of abstraction exceeds %d %% in frame %d.  ", pPars->nRatioMin, p->pPars->iFrameProved+1 );
        else
            Abc_Print( 1, "GLA finished %d frames and produced a %d-stable abstraction.  ", p->pPars->iFrameProved+1, p->pPars->nFramesNoChange );
        p->pPars->iFrame = p->pPars->iFrameProved;
    }
    else
    {
        if ( p->pPars->fVerbose )
            Abc_Print( 1, "\n" );
        if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            Abc_Print( 1, "    Gia_ManPerformGlaOld(): CEX verification has failed!\n" );
        Abc_Print( 1, "True counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = f - 1;
        Vec_IntFreeP( &pAig->vGateClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex - p->timeInit;
        ABC_PRTP( "Runtime: Initializing", p->timeInit,   Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Ga2_ManReportMemory( p );
    }
//    Ga2_ManDumpStats( p->pGia, p->pPars, p->pSat, p->pPars->iFrameProved, 0 );
    Ga2_ManStop( p );
    fflush( stdout );
    return RetValue;
}